

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O2

int nn_ins_bind(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  int iVar2;
  nn_list_item *pnVar3;
  nn_list_item *pnVar4;
  char *pcVar5;
  char *pcVar6;
  nn_ins_item *it;
  nn_ins_item *pnVar7;
  
  nn_mutex_lock(&self.sync);
  pnVar3 = nn_list_begin(&self.bound);
  iVar2 = -0x62;
  while( true ) {
    pnVar4 = nn_list_end(&self.bound);
    if (pnVar3 == pnVar4) break;
    pcVar5 = nn_ep_getaddr((nn_ep *)pnVar3[1].next);
    pcVar6 = nn_ep_getaddr(item->ep);
    iVar1 = strncmp(pcVar5,pcVar6,0x80);
    if (iVar1 == 0) goto LAB_0011de4d;
    pnVar3 = nn_list_next(&self.bound,pnVar3);
  }
  pnVar3 = nn_list_end(&self.bound);
  nn_list_insert(&self.bound,&item->item,pnVar3);
  it = (nn_ins_item *)nn_list_begin(&self.connected);
  while( true ) {
    pnVar7 = (nn_ins_item *)nn_list_end(&self.connected);
    if (it == pnVar7) break;
    pcVar5 = nn_ep_getaddr(item->ep);
    pcVar6 = nn_ep_getaddr(it->ep);
    iVar2 = strncmp(pcVar5,pcVar6,0x80);
    if (iVar2 == 0) {
      iVar2 = nn_ep_ispeer_ep(item->ep,it->ep);
      if (iVar2 != 0) {
        (*fn)(item,it);
      }
    }
    it = (nn_ins_item *)nn_list_next(&self.connected,&it->item);
  }
  iVar2 = 0;
LAB_0011de4d:
  nn_mutex_unlock(&self.sync);
  return iVar2;
}

Assistant:

int nn_ins_bind (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;
    struct nn_ins_item *citem;

    nn_mutex_lock (&self.sync);

    /*  Check whether the endpoint isn't already bound. */
    /*  TODO:  This is an O(n) algorithm! */
    for (it = nn_list_begin (&self.bound); it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);

        if (strncmp (nn_ep_getaddr(bitem->ep), nn_ep_getaddr(item->ep),
            NN_SOCKADDR_MAX) == 0) {

            nn_mutex_unlock (&self.sync);
            return -EADDRINUSE;
        }
    }

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.bound, &item->item,
        nn_list_end (&self.bound));

    /*  During this process new pipes may be created. */
    for (it = nn_list_begin (&self.connected);
          it != nn_list_end (&self.connected);
          it = nn_list_next (&self.connected, it)) {
        citem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_ep_getaddr(item->ep), nn_ep_getaddr(citem->ep),
            NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_ep_ispeer_ep (item->ep, citem->ep))
                continue;

            fn (item, citem);
        }
    }

    nn_mutex_unlock (&self.sync);

    return 0;
}